

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::trivialHeuristic(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp)

{
  long lVar1;
  undefined8 *puVar2;
  uint *puVar3;
  Tolerances *pTVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Item *pIVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  undefined8 uVar8;
  pointer pnVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Real RVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  fpclass_type fVar17;
  double *pdVar18;
  cpp_dec_float<50U,_int,_void> *pcVar19;
  fpclass_type fVar20;
  cpp_dec_float<50U,_int,_void> *pcVar21;
  fpclass_type fVar22;
  long lVar23;
  cpp_dec_float<50U,_int,_void> *pcVar24;
  int32_t iVar25;
  uint uVar26;
  byte bVar27;
  long lVar28;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  locksol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  uppersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  lowersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  zerosol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lockObj;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upperObj;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowerObj;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  zeroObj;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_85c;
  cpp_dec_float<50U,_int,_void> local_858;
  cpp_dec_float<50U,_int,_void> local_818;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_7e0;
  uint local_7d8 [2];
  uint auStack_7d0 [2];
  uint local_7c8 [2];
  uint auStack_7c0 [2];
  uint local_7b8;
  long local_7a8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_7a0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_788;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_770;
  cpp_dec_float<50U,_int,_void> local_758;
  cpp_dec_float<50U,_int,_void> local_718;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_6c0;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_6a8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_690;
  cpp_dec_float<50U,_int,_void> local_678;
  cpp_dec_float<50U,_int,_void> local_638;
  cpp_dec_float<50U,_int,_void> local_5f8;
  cpp_dec_float<50U,_int,_void> local_5b8;
  undefined4 local_578;
  uint uStack_574;
  undefined4 uStack_570;
  uint uStack_56c;
  long local_568;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_560;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_548;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_530;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_518;
  cpp_dec_float<50U,_int,_void> local_500;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_488;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_350;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_318;
  cpp_dec_float<50U,_int,_void> local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  cpp_dec_float<50U,_int,_void> local_118;
  cpp_dec_float<50U,_int,_void> local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_690,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_6a8,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_6c0,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_770,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_788,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_7a0,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  local_5b8.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_5b8.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_5b8.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_5b8.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_5b8.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_678.exp =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.exp;
  local_678.neg =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.neg;
  local_678.fpclass =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.fpclass;
  local_678.prec_elem =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.prec_elem;
  local_5f8.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_5f8.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_5f8.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_5f8.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_5f8.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_638.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_638.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_638.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_638.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_638.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_678.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_678.data._M_elems[0] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[0];
  local_678.data._M_elems[1] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[1];
  local_678.data._M_elems[2] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[2];
  local_678.data._M_elems[3] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[3];
  local_678.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_678.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_638.exp = local_678.exp;
  local_638.neg = local_678.neg;
  local_638.fpclass = local_678.fpclass;
  local_638.prec_elem = local_678.prec_elem;
  local_5f8.exp = local_678.exp;
  local_5f8.neg = local_678.neg;
  local_5f8.fpclass = local_678.fpclass;
  local_5f8.prec_elem = local_678.prec_elem;
  local_5b8.exp = local_678.exp;
  local_5b8.neg = local_678.neg;
  local_5b8.fpclass = local_678.fpclass;
  local_5b8.prec_elem = local_678.prec_elem;
  ::soplex::infinity::__tls_init();
  pdVar18 = (double *)__tls_get_addr(&PTR_003b4b70);
  local_6d8 = *pdVar18;
  local_718.fpclass = cpp_dec_float_finite;
  local_718.prec_elem = 10;
  local_718.data._M_elems[0] = 0;
  local_718.data._M_elems[1] = 0;
  local_718.data._M_elems[2] = 0;
  local_718.data._M_elems[3] = 0;
  local_718.data._M_elems[4] = 0;
  local_718.data._M_elems[5] = 0;
  local_718.data._M_elems[6] = 0;
  local_718.data._M_elems[7] = 0;
  local_718.data._M_elems[8] = 0;
  local_718.data._M_elems[9] = 0;
  local_718.exp = 0;
  local_718.neg = false;
  uStack_6d0 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_718,local_6d8);
  feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_818,this);
  local_118.fpclass = cpp_dec_float_finite;
  local_118.prec_elem = 10;
  local_118.data._M_elems[0] = 0;
  local_118.data._M_elems[1] = 0;
  local_118.data._M_elems[2] = 0;
  local_118.data._M_elems[3] = 0;
  local_118.data._M_elems[4] = 0;
  local_118.data._M_elems[5] = 0;
  local_118.data._M_elems._24_5_ = 0;
  local_118.data._M_elems[7]._1_3_ = 0;
  local_118.data._M_elems._32_5_ = 0;
  local_118._37_8_ = 0;
  local_858.fpclass = cpp_dec_float_finite;
  local_858.prec_elem = 10;
  local_858.data._M_elems[0] = 0;
  local_858.data._M_elems[1] = 0;
  local_858.data._M_elems[2] = 0;
  local_858.data._M_elems[3] = 0;
  local_858.data._M_elems[4] = 0;
  local_858.data._M_elems[5] = 0;
  local_858.data._M_elems[6] = 0;
  local_858.data._M_elems[7] = 0;
  local_858.data._M_elems[8] = 0;
  local_858.data._M_elems[9] = 0;
  local_858.exp = 0;
  local_858.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_858,1.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_118,&local_858,&local_818);
  ::soplex::infinity::__tls_init();
  local_a8.m_backend.fpclass = cpp_dec_float_finite;
  local_a8.m_backend.prec_elem = 10;
  local_a8.m_backend.data._M_elems[0] = 0;
  local_a8.m_backend.data._M_elems[1] = 0;
  local_a8.m_backend.data._M_elems[2] = 0;
  local_a8.m_backend.data._M_elems[3] = 0;
  local_a8.m_backend.data._M_elems[4] = 0;
  local_a8.m_backend.data._M_elems[5] = 0;
  local_a8.m_backend.data._M_elems._24_5_ = 0;
  local_a8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_a8.m_backend.data._M_elems._32_5_ = 0;
  local_a8.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_a8,local_6d8);
  pTVar4 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  RVar10 = Tolerances::epsilon(pTVar4);
  bVar14 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_118,&local_a8,RVar10);
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  if (bVar14) {
    feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&local_758,this);
    local_818.fpclass = cpp_dec_float_finite;
    local_818.prec_elem = 10;
    local_818.data._M_elems[0] = 0;
    local_818.data._M_elems[1] = 0;
    local_818.data._M_elems[2] = 0;
    local_818.data._M_elems[3] = 0;
    local_818.data._M_elems[4] = 0;
    local_818.data._M_elems[5] = 0;
    local_818.data._M_elems[6] = 0;
    local_818.data._M_elems[7] = 0;
    local_818.data._M_elems[8] = 0;
    local_818.data._M_elems[9] = 0;
    local_818.exp = 0;
    local_818.neg = false;
    local_858.fpclass = cpp_dec_float_finite;
    local_858.prec_elem = 10;
    local_858.data._M_elems[0] = 0;
    local_858.data._M_elems[1] = 0;
    local_858.data._M_elems[2] = 0;
    local_858.data._M_elems[3] = 0;
    local_858.data._M_elems[4] = 0;
    local_858.data._M_elems[5] = 0;
    local_858.data._M_elems[6] = 0;
    local_858.data._M_elems[7] = 0;
    local_858.data._M_elems[8] = 0;
    local_858.data._M_elems[9] = 0;
    local_858.exp = 0;
    local_858.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_858,1.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_818,&local_858,&local_758);
    local_718.data._M_elems[0] = local_818.data._M_elems[0];
    local_718.data._M_elems[1] = local_818.data._M_elems[1];
    local_718.data._M_elems[2] = local_818.data._M_elems[2];
    local_718.data._M_elems[3] = local_818.data._M_elems[3];
    local_718.data._M_elems[4] = local_818.data._M_elems[4];
    local_718.data._M_elems[5] = local_818.data._M_elems[5];
    local_718.data._M_elems[6] = local_818.data._M_elems[6];
    local_718.data._M_elems[7] = local_818.data._M_elems[7];
    local_718.data._M_elems[8] = local_818.data._M_elems[8];
    local_718.data._M_elems[9] = local_818.data._M_elems[9];
    local_718.exp = local_818.exp;
    local_718.neg = local_818.neg;
    local_718.fpclass = local_818.fpclass;
    local_718.prec_elem = local_818.prec_elem;
  }
  lVar23 = (long)(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  if (lVar23 < 1) {
    bVar14 = true;
  }
  else {
    uStack_574 = local_6d8._4_4_ ^ 0x80000000;
    uStack_56c = uStack_6d0._4_4_ ^ 0x80000000;
    local_578 = (undefined4)local_6d8;
    uStack_570 = (undefined4)uStack_6d0;
    bVar14 = true;
    local_7e0 = lp;
    do {
      lVar1 = lVar23 + -1;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&local_788.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,0);
      local_7a8 = lVar23;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&local_7a0.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,0);
      pIVar6 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      iVar16 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[lVar1].idx;
      local_568 = lVar1;
      if (0 < pIVar6[iVar16].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar6 = pIVar6 + iVar16;
        lVar23 = 0;
        lVar28 = 0;
        do {
          pNVar7 = (pIVar6->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          uVar8 = *(undefined8 *)((long)&(pNVar7->val).m_backend.data + lVar23 + 0x20);
          local_818.data._M_elems[8] = (uint)uVar8;
          local_818.data._M_elems[9] = (uint)((ulong)uVar8 >> 0x20);
          puVar2 = (undefined8 *)((long)&(pNVar7->val).m_backend.data + lVar23);
          uVar8 = *puVar2;
          uVar11 = puVar2[1];
          puVar2 = (undefined8 *)((long)&(pNVar7->val).m_backend.data + lVar23 + 0x10);
          uVar12 = *puVar2;
          uVar13 = puVar2[1];
          local_818.data._M_elems[4] = (uint)uVar12;
          local_818.data._M_elems[5] = (uint)((ulong)uVar12 >> 0x20);
          local_818.data._M_elems[6] = (uint)uVar13;
          local_818.data._M_elems[7] = (uint)((ulong)uVar13 >> 0x20);
          local_818.data._M_elems[0] = (uint)uVar8;
          local_818.data._M_elems[1] = (uint)((ulong)uVar8 >> 0x20);
          local_818.data._M_elems[2] = (uint)uVar11;
          local_818.data._M_elems[3] = (uint)((ulong)uVar11 >> 0x20);
          local_818.exp = *(int *)((long)&(pNVar7->val).m_backend.data + lVar23 + 0x28);
          local_818.neg = *(bool *)((long)&(pNVar7->val).m_backend.data + lVar23 + 0x2c);
          local_818._48_8_ = *(undefined8 *)((long)&(pNVar7->val).m_backend.data + lVar23 + 0x30);
          iVar16 = *(int *)((long)(&((pIVar6->data).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar23);
          pnVar9 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_388.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)&pnVar9[iVar16].m_backend.data + 0x20);
          local_388.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[iVar16].m_backend.data;
          local_388.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((long)&pnVar9[iVar16].m_backend.data + 8);
          puVar3 = (uint *)((long)&pnVar9[iVar16].m_backend.data + 0x10);
          local_388.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
          local_388.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
          local_388.m_backend.exp = pnVar9[iVar16].m_backend.exp;
          local_388.m_backend.neg = pnVar9[iVar16].m_backend.neg;
          local_388.m_backend.fpclass = pnVar9[iVar16].m_backend.fpclass;
          local_388.m_backend.prec_elem = pnVar9[iVar16].m_backend.prec_elem;
          ::soplex::infinity::__tls_init();
          local_158.m_backend.fpclass = cpp_dec_float_finite;
          local_158.m_backend.prec_elem = 10;
          local_158.m_backend.data._M_elems[0] = 0;
          local_158.m_backend.data._M_elems[1] = 0;
          local_158.m_backend.data._M_elems[2] = 0;
          local_158.m_backend.data._M_elems[3] = 0;
          local_158.m_backend.data._M_elems[4] = 0;
          local_158.m_backend.data._M_elems[5] = 0;
          local_158.m_backend.data._M_elems._24_5_ = 0;
          local_158.m_backend.data._M_elems[7]._1_3_ = 0;
          local_158.m_backend.data._M_elems._32_5_ = 0;
          local_158.m_backend._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_158,
                     (double)CONCAT44(uStack_574,local_578));
          pTVar4 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          p_Var5 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            }
          }
          RVar10 = Tolerances::epsilon(pTVar4);
          bVar15 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                             (&local_388,&local_158,RVar10);
          if (bVar15) {
            iVar16 = *(int *)((long)(&((pIVar6->data).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val + 1) + lVar23);
            pnVar9 = (lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_3c8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)&pnVar9[iVar16].m_backend.data + 0x20);
            local_3c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[iVar16].m_backend.data;
            local_3c8.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((long)&pnVar9[iVar16].m_backend.data + 8);
            puVar3 = (uint *)((long)&pnVar9[iVar16].m_backend.data + 0x10);
            local_3c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
            local_3c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
            local_3c8.m_backend.exp = pnVar9[iVar16].m_backend.exp;
            local_3c8.m_backend.neg = pnVar9[iVar16].m_backend.neg;
            local_3c8.m_backend.fpclass = pnVar9[iVar16].m_backend.fpclass;
            local_3c8.m_backend.prec_elem = pnVar9[iVar16].m_backend.prec_elem;
            ::soplex::infinity::__tls_init();
            local_198.m_backend.fpclass = cpp_dec_float_finite;
            local_198.m_backend.prec_elem = 10;
            local_198.m_backend.data._M_elems[0] = 0;
            local_198.m_backend.data._M_elems[1] = 0;
            local_198.m_backend.data._M_elems[2] = 0;
            local_198.m_backend.data._M_elems[3] = 0;
            local_198.m_backend.data._M_elems[4] = 0;
            local_198.m_backend.data._M_elems[5] = 0;
            local_198.m_backend.data._M_elems._24_5_ = 0;
            local_198.m_backend.data._M_elems[7]._1_3_ = 0;
            local_198.m_backend.data._M_elems._32_5_ = 0;
            local_198.m_backend._37_8_ = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_198,local_6d8);
            pTVar4 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            this_00 = (this->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._tolerances.
                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            RVar10 = Tolerances::epsilon(pTVar4);
            bVar15 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                               (&local_3c8,&local_198,RVar10);
            lp = local_7e0;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              lp = local_7e0;
            }
          }
          else {
            bVar15 = false;
          }
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          pnVar9 = local_788.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (bVar15 == false) {
            iVar16 = *(int *)((long)(&((pIVar6->data).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val + 1) + lVar23);
            pnVar9 = (lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_408.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)&pnVar9[iVar16].m_backend.data + 0x20);
            local_408.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[iVar16].m_backend.data;
            local_408.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((long)&pnVar9[iVar16].m_backend.data + 8);
            puVar3 = (uint *)((long)&pnVar9[iVar16].m_backend.data + 0x10);
            local_408.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
            local_408.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
            local_408.m_backend.exp = pnVar9[iVar16].m_backend.exp;
            local_408.m_backend.neg = pnVar9[iVar16].m_backend.neg;
            local_408.m_backend.fpclass = pnVar9[iVar16].m_backend.fpclass;
            local_408.m_backend.prec_elem = pnVar9[iVar16].m_backend.prec_elem;
            ::soplex::infinity::__tls_init();
            local_1d8.m_backend.fpclass = cpp_dec_float_finite;
            local_1d8.m_backend.prec_elem = 10;
            local_1d8.m_backend.data._M_elems[0] = 0;
            local_1d8.m_backend.data._M_elems[1] = 0;
            local_1d8.m_backend.data._M_elems[2] = 0;
            local_1d8.m_backend.data._M_elems[3] = 0;
            local_1d8.m_backend.data._M_elems[4] = 0;
            local_1d8.m_backend.data._M_elems[5] = 0;
            local_1d8.m_backend.data._M_elems._24_5_ = 0;
            local_1d8.m_backend.data._M_elems[7]._1_3_ = 0;
            local_1d8.m_backend.data._M_elems._32_5_ = 0;
            local_1d8.m_backend._37_8_ = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_1d8,
                       (double)CONCAT44(uStack_574,local_578));
            pTVar4 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var5 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              }
            }
            RVar10 = Tolerances::epsilon(pTVar4);
            bVar15 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                               (&local_408,&local_1d8,RVar10);
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
            }
            lp = local_7e0;
            if (bVar15) {
              if (local_818.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_858,0,(type *)0x0);
                iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_818,&local_858);
                pnVar9 = local_7a0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (iVar16 < 1) {
                  if (local_818.fpclass != cpp_dec_float_NaN) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<long_long>(&local_858,0,(type *)0x0);
                    iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_818,&local_858);
                    pnVar9 = local_788.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    if (iVar16 < 0) {
                      local_858.fpclass = cpp_dec_float_finite;
                      local_858.prec_elem = 10;
                      local_858.data._M_elems[0] = 0;
                      local_858.data._M_elems[1] = 0;
                      local_858.data._M_elems[2] = 0;
                      local_858.data._M_elems[3] = 0;
                      local_858.data._M_elems[4] = 0;
                      local_858.data._M_elems[5] = 0;
                      local_858.data._M_elems[6] = 0;
                      local_858.data._M_elems[7] = 0;
                      local_858.data._M_elems[8] = 0;
                      local_858.data._M_elems[9] = 0;
                      local_858.exp = 0;
                      local_858.neg = false;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                      from_unsigned_long_long(&local_858,1);
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                                (&pnVar9[lVar1].m_backend,&local_858);
                    }
                  }
                }
                else {
                  local_858.fpclass = cpp_dec_float_finite;
                  local_858.prec_elem = 10;
                  local_858.data._M_elems[0] = 0;
                  local_858.data._M_elems[1] = 0;
                  local_858.data._M_elems[2] = 0;
                  local_858.data._M_elems[3] = 0;
                  local_858.data._M_elems[4] = 0;
                  local_858.data._M_elems[5] = 0;
                  local_858.data._M_elems[6] = 0;
                  local_858.data._M_elems[7] = 0;
                  local_858.data._M_elems[8] = 0;
                  local_858.data._M_elems[9] = 0;
                  local_858.exp = 0;
                  local_858.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  from_unsigned_long_long(&local_858,1);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&pnVar9[lVar1].m_backend,&local_858);
                }
              }
            }
            else {
              iVar16 = *(int *)((long)(&((pIVar6->data).
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem)->val + 1) + lVar23);
              pnVar9 = (local_7e0->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_448.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)&pnVar9[iVar16].m_backend.data + 0x20);
              local_448.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)&pnVar9[iVar16].m_backend.data;
              local_448.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((long)&pnVar9[iVar16].m_backend.data + 8);
              puVar3 = (uint *)((long)&pnVar9[iVar16].m_backend.data + 0x10);
              local_448.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
              local_448.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
              local_448.m_backend.exp = pnVar9[iVar16].m_backend.exp;
              local_448.m_backend.neg = pnVar9[iVar16].m_backend.neg;
              local_448.m_backend.fpclass = pnVar9[iVar16].m_backend.fpclass;
              local_448.m_backend.prec_elem = pnVar9[iVar16].m_backend.prec_elem;
              ::soplex::infinity::__tls_init();
              local_218.m_backend.fpclass = cpp_dec_float_finite;
              local_218.m_backend.prec_elem = 10;
              local_218.m_backend.data._M_elems[0] = 0;
              local_218.m_backend.data._M_elems[1] = 0;
              local_218.m_backend.data._M_elems[2] = 0;
              local_218.m_backend.data._M_elems[3] = 0;
              local_218.m_backend.data._M_elems[4] = 0;
              local_218.m_backend.data._M_elems[5] = 0;
              local_218.m_backend.data._M_elems._24_5_ = 0;
              local_218.m_backend.data._M_elems[7]._1_3_ = 0;
              local_218.m_backend.data._M_elems._32_5_ = 0;
              local_218.m_backend._37_8_ = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_218,local_6d8);
              pTVar4 = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var5 = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                }
              }
              RVar10 = Tolerances::epsilon(pTVar4);
              bVar15 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                 (&local_448,&local_218,RVar10);
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              lp = local_7e0;
              if (bVar15 && local_818.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_858,0,(type *)0x0);
                iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_818,&local_858);
                pnVar9 = local_788.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (iVar16 < 1) {
                  if (local_818.fpclass != cpp_dec_float_NaN) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<long_long>(&local_858,0,(type *)0x0);
                    iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_818,&local_858);
                    pnVar9 = local_7a0.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    if (iVar16 < 0) {
                      local_858.fpclass = cpp_dec_float_finite;
                      local_858.prec_elem = 10;
                      local_858.data._M_elems[0] = 0;
                      local_858.data._M_elems[1] = 0;
                      local_858.data._M_elems[2] = 0;
                      local_858.data._M_elems[3] = 0;
                      local_858.data._M_elems[4] = 0;
                      local_858.data._M_elems[5] = 0;
                      local_858.data._M_elems[6] = 0;
                      local_858.data._M_elems[7] = 0;
                      local_858.data._M_elems[8] = 0;
                      local_858.data._M_elems[9] = 0;
                      local_858.exp = 0;
                      local_858.neg = false;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                      from_unsigned_long_long(&local_858,1);
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                                (&pnVar9[lVar1].m_backend,&local_858);
                    }
                  }
                }
                else {
                  local_858.fpclass = cpp_dec_float_finite;
                  local_858.prec_elem = 10;
                  local_858.data._M_elems[0] = 0;
                  local_858.data._M_elems[1] = 0;
                  local_858.data._M_elems[2] = 0;
                  local_858.data._M_elems[3] = 0;
                  local_858.data._M_elems[4] = 0;
                  local_858.data._M_elems[5] = 0;
                  local_858.data._M_elems[6] = 0;
                  local_858.data._M_elems[7] = 0;
                  local_858.data._M_elems[8] = 0;
                  local_858.data._M_elems[9] = 0;
                  local_858.exp = 0;
                  local_858.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  from_unsigned_long_long(&local_858,1);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&pnVar9[lVar1].m_backend,&local_858);
                }
              }
            }
          }
          else {
            local_858.fpclass = cpp_dec_float_finite;
            local_858.prec_elem = 10;
            local_858.data._M_elems[0] = 0;
            local_858.data._M_elems[1] = 0;
            local_858.data._M_elems[2] = 0;
            local_858.data._M_elems[3] = 0;
            local_858.data._M_elems[4] = 0;
            local_858.data._M_elems[5] = 0;
            local_858.data._M_elems[6] = 0;
            local_858.data._M_elems[7] = 0;
            local_858.data._M_elems[8] = 0;
            local_858.data._M_elems[9] = 0;
            local_858.exp = 0;
            local_858.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::from_unsigned_long_long
                      (&local_858,1);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&pnVar9[lVar1].m_backend,&local_858);
            pnVar9 = local_7a0.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_858.fpclass = cpp_dec_float_finite;
            local_858.prec_elem = 10;
            local_858.data._M_elems[0] = 0;
            local_858.data._M_elems[1] = 0;
            local_858.data._M_elems[2] = 0;
            local_858.data._M_elems[3] = 0;
            local_858.data._M_elems[4] = 0;
            local_858.data._M_elems[5] = 0;
            local_858.data._M_elems[6] = 0;
            local_858.data._M_elems[7] = 0;
            local_858.data._M_elems[8] = 0;
            local_858.data._M_elems[9] = 0;
            local_858.exp = 0;
            local_858.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::from_unsigned_long_long
                      (&local_858,1);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&pnVar9[lVar1].m_backend,&local_858);
          }
          lVar28 = lVar28 + 1;
          lVar23 = lVar23 + 0x3c;
        } while (lVar28 < (pIVar6->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      pnVar9 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar26 = pnVar9[lVar1].m_backend.data._M_elems[0];
      local_7b8 = *(uint *)((long)&pnVar9[lVar1].m_backend.data + 0x24);
      puVar3 = (uint *)((long)&pnVar9[lVar1].m_backend.data + 0x14);
      local_7c8 = *(uint (*) [2])puVar3;
      auStack_7c0 = *(uint (*) [2])(puVar3 + 2);
      puVar3 = (uint *)((long)&pnVar9[lVar1].m_backend.data + 4);
      local_7d8 = *(uint (*) [2])puVar3;
      auStack_7d0 = *(uint (*) [2])(puVar3 + 2);
      local_85c = pnVar9[lVar1].m_backend.exp;
      bVar27 = pnVar9[lVar1].m_backend.neg;
      fVar22 = pnVar9[lVar1].m_backend.fpclass;
      iVar25 = pnVar9[lVar1].m_backend.prec_elem;
      pnVar9 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = *(undefined8 *)((long)&pnVar9[lVar1].m_backend.data + 0x20);
      local_818.data._M_elems[8] = (uint)uVar8;
      local_818.data._M_elems[9] = (uint)((ulong)uVar8 >> 0x20);
      uVar8 = *(undefined8 *)&pnVar9[lVar1].m_backend.data;
      uVar11 = *(undefined8 *)((long)&pnVar9[lVar1].m_backend.data + 8);
      puVar3 = (uint *)((long)&pnVar9[lVar1].m_backend.data + 0x10);
      uVar12 = *(undefined8 *)puVar3;
      uVar13 = *(undefined8 *)(puVar3 + 2);
      local_818.data._M_elems[4] = (uint)uVar12;
      local_818.data._M_elems[5] = (uint)((ulong)uVar12 >> 0x20);
      local_818.data._M_elems[6] = (uint)uVar13;
      local_818.data._M_elems[7] = (uint)((ulong)uVar13 >> 0x20);
      local_818.data._M_elems[0] = (uint)uVar8;
      local_818.data._M_elems[1] = (uint)((ulong)uVar8 >> 0x20);
      local_818.data._M_elems[2] = (uint)uVar11;
      local_818.data._M_elems[3] = (uint)((ulong)uVar11 >> 0x20);
      local_818.exp = pnVar9[lVar1].m_backend.exp;
      local_818.neg = pnVar9[lVar1].m_backend.neg;
      local_818.fpclass = pnVar9[lVar1].m_backend.fpclass;
      local_818.prec_elem = pnVar9[lVar1].m_backend.prec_elem;
      local_350.m_backend.data._M_elems[0] = uVar26;
      local_350.m_backend.data._M_elems._4_8_ = local_7d8;
      local_350.m_backend.data._M_elems._12_8_ = auStack_7d0;
      local_350.m_backend.data._M_elems._20_8_ = local_7c8;
      local_350.m_backend.data._M_elems._28_8_ = auStack_7c0;
      local_350.m_backend.data._M_elems[9] = local_7b8;
      local_350.m_backend.exp = local_85c;
      local_350.m_backend.neg = (bool)bVar27;
      local_350.m_backend.fpclass = fVar22;
      local_350.m_backend.prec_elem = iVar25;
      ::soplex::infinity::__tls_init();
      local_258.m_backend.fpclass = cpp_dec_float_finite;
      local_258.m_backend.prec_elem = 10;
      local_258.m_backend.data._M_elems[0] = 0;
      local_258.m_backend.data._M_elems[1] = 0;
      local_258.m_backend.data._M_elems[2] = 0;
      local_258.m_backend.data._M_elems[3] = 0;
      local_258.m_backend.data._M_elems[4] = 0;
      local_258.m_backend.data._M_elems[5] = 0;
      local_258.m_backend.data._M_elems._24_5_ = 0;
      local_258.m_backend.data._M_elems[7]._1_3_ = 0;
      local_258.m_backend.data._M_elems._32_5_ = 0;
      local_258.m_backend._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_258,(double)CONCAT44(uStack_574,local_578));
      pTVar4 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var5 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      RVar10 = Tolerances::epsilon(pTVar4);
      bVar15 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_350,&local_258,RVar10);
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if (bVar15) {
        local_858.data._M_elems[0] = local_718.data._M_elems[0];
        local_858.data._M_elems[1] = local_718.data._M_elems[1];
        local_858.data._M_elems[2] = local_718.data._M_elems[2];
        local_858.data._M_elems[3] = local_718.data._M_elems[3];
        local_858.data._M_elems[8] = local_718.data._M_elems[8];
        local_858.data._M_elems[9] = local_718.data._M_elems[9];
        local_858.data._M_elems[4] = local_718.data._M_elems[4];
        local_858.data._M_elems[5] = local_718.data._M_elems[5];
        local_858.data._M_elems[6] = local_718.data._M_elems[6];
        local_858.data._M_elems[7] = local_718.data._M_elems[7];
        local_858.exp = local_718.exp;
        local_858.neg = local_718.neg;
        local_858.fpclass = local_718.fpclass;
        local_858.prec_elem = local_718.prec_elem;
        if (local_718.data._M_elems[0] != 0 || local_718.fpclass != cpp_dec_float_finite) {
          local_858.neg = (bool)(local_718.neg ^ 1);
        }
        if (local_818.fpclass == cpp_dec_float_NaN || local_718.fpclass == cpp_dec_float_NaN) {
LAB_003126f7:
          local_85c = local_818.exp;
          local_758.data._M_elems[1] = local_818.data._M_elems[2];
          local_758.data._M_elems[0] = local_818.data._M_elems[1];
          local_758.data._M_elems[3] = local_818.data._M_elems[4];
          local_758.data._M_elems[2] = local_818.data._M_elems[3];
          local_758.data._M_elems[5] = local_818.data._M_elems[6];
          local_758.data._M_elems[4] = local_818.data._M_elems[5];
          local_758.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_818.data._M_elems[8],local_818.data._M_elems[7]),0);
          local_758.data._M_elems[7]._1_3_ = (undefined3)(local_818.data._M_elems[8] >> 8);
          local_758.data._M_elems[8] = local_818.data._M_elems[9];
          uVar26 = local_818.data._M_elems[0];
          bVar27 = local_818.neg;
          fVar22 = local_818.fpclass;
          iVar25 = local_818.prec_elem;
        }
        else {
          iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_858,&local_818);
          if (-1 < iVar16) {
            goto LAB_003126f7;
          }
          local_85c = local_718.exp;
          local_758.data._M_elems[1] = local_718.data._M_elems[2];
          local_758.data._M_elems[0] = local_718.data._M_elems[1];
          local_758.data._M_elems[3] = local_718.data._M_elems[4];
          local_758.data._M_elems[2] = local_718.data._M_elems[3];
          local_758.data._M_elems[5] = local_718.data._M_elems[6];
          local_758.data._M_elems[4] = local_718.data._M_elems[5];
          local_758.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_718.data._M_elems[8],local_718.data._M_elems[7]),0);
          local_758.data._M_elems[7]._1_3_ = (undefined3)(local_718.data._M_elems[8] >> 8);
          local_758.data._M_elems[8] = local_718.data._M_elems[9];
          uVar26 = 0;
          iVar25 = local_718.prec_elem;
          if (local_718.fpclass == cpp_dec_float_finite && local_718.data._M_elems[0] == 0) {
            bVar27 = local_718.neg;
            fVar22 = cpp_dec_float_finite;
          }
          else {
            bVar27 = local_718.neg ^ 1;
            uVar26 = local_718.data._M_elems[0];
            fVar22 = local_718.fpclass;
          }
        }
        local_7b8 = local_758.data._M_elems[8];
        auStack_7c0[1]._1_3_ = local_758.data._M_elems[7]._1_3_;
        auStack_7c0._0_5_ = local_758.data._M_elems._24_5_;
        local_7c8[0] = local_758.data._M_elems[4];
        local_7c8[1] = local_758.data._M_elems[5];
        local_7d8[0] = local_758.data._M_elems[0];
        local_7d8[1] = local_758.data._M_elems[1];
        auStack_7d0[0] = local_758.data._M_elems[2];
        auStack_7d0[1] = local_758.data._M_elems[3];
      }
      local_488.m_backend.data._M_elems[9] = local_818.data._M_elems[9];
      local_488.m_backend.data._M_elems[8] = local_818.data._M_elems[8];
      local_488.m_backend.data._M_elems[1] = local_818.data._M_elems[1];
      local_488.m_backend.data._M_elems[0] = local_818.data._M_elems[0];
      local_488.m_backend.data._M_elems[3] = local_818.data._M_elems[3];
      local_488.m_backend.data._M_elems[2] = local_818.data._M_elems[2];
      local_488.m_backend.data._M_elems[5] = local_818.data._M_elems[5];
      local_488.m_backend.data._M_elems[4] = local_818.data._M_elems[4];
      local_488.m_backend.data._M_elems[7] = local_818.data._M_elems[7];
      local_488.m_backend.data._M_elems[6] = local_818.data._M_elems[6];
      local_488.m_backend.exp = local_818.exp;
      local_488.m_backend.neg = local_818.neg;
      local_488.m_backend.fpclass = local_818.fpclass;
      local_488.m_backend.prec_elem = local_818.prec_elem;
      ::soplex::infinity::__tls_init();
      local_298.m_backend.fpclass = cpp_dec_float_finite;
      local_298.m_backend.prec_elem = 10;
      local_298.m_backend.data._M_elems[0] = 0;
      local_298.m_backend.data._M_elems[1] = 0;
      local_298.m_backend.data._M_elems[2] = 0;
      local_298.m_backend.data._M_elems[3] = 0;
      local_298.m_backend.data._M_elems[4] = 0;
      local_298.m_backend.data._M_elems[5] = 0;
      local_298.m_backend.data._M_elems._24_5_ = 0;
      local_298.m_backend.data._M_elems[7]._1_3_ = 0;
      local_298.m_backend.data._M_elems._32_5_ = 0;
      local_298.m_backend._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_298,local_6d8);
      pTVar4 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var5 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      RVar10 = Tolerances::epsilon(pTVar4);
      bVar15 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_488,&local_298,RVar10);
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      lp = local_7e0;
      if (bVar15) {
        pnVar9 = (local_7e0->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar21 = &local_718;
        if ((pnVar9[lVar1].m_backend.fpclass != cpp_dec_float_NaN) &&
           (local_718.fpclass != cpp_dec_float_NaN)) {
          iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&pnVar9[lVar1].m_backend,pcVar21);
          pcVar21 = &local_718;
          if (0 < iVar16) {
            pcVar21 = &(lp->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
          }
        }
        uVar8 = *(undefined8 *)((pcVar21->data)._M_elems + 8);
        local_818.data._M_elems[8] = (uint)uVar8;
        local_818.data._M_elems[9] = (uint)((ulong)uVar8 >> 0x20);
        uVar8 = *(undefined8 *)(pcVar21->data)._M_elems;
        uVar11 = *(undefined8 *)((pcVar21->data)._M_elems + 2);
        uVar12 = *(undefined8 *)((pcVar21->data)._M_elems + 4);
        uVar13 = *(undefined8 *)((pcVar21->data)._M_elems + 6);
        local_818.data._M_elems[4] = (uint)uVar12;
        local_818.data._M_elems[5] = (uint)((ulong)uVar12 >> 0x20);
        local_818.data._M_elems[6] = (uint)uVar13;
        local_818.data._M_elems[7] = (uint)((ulong)uVar13 >> 0x20);
        local_818.data._M_elems[0] = (uint)uVar8;
        local_818.data._M_elems[1] = (uint)((ulong)uVar8 >> 0x20);
        local_818.data._M_elems[2] = (uint)uVar11;
        local_818.data._M_elems[3] = (uint)((ulong)uVar11 >> 0x20);
        local_818.exp = pcVar21->exp;
        local_818.neg = pcVar21->neg;
        local_818.fpclass = pcVar21->fpclass;
        local_818.prec_elem = pcVar21->prec_elem;
      }
      if (bVar14) {
        local_2d8.fpclass = cpp_dec_float_finite;
        local_2d8.prec_elem = 10;
        local_2d8.data._M_elems[0] = 0;
        local_2d8.data._M_elems[1] = 0;
        local_2d8.data._M_elems[2] = 0;
        local_2d8.data._M_elems[3] = 0;
        local_2d8.data._M_elems[4] = 0;
        local_2d8.data._M_elems[5] = 0;
        local_2d8.data._M_elems._24_5_ = 0;
        local_2d8.data._M_elems[7]._1_3_ = 0;
        local_2d8.data._M_elems._32_5_ = 0;
        local_2d8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_2d8,0.0);
        feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_e0,this);
        local_858.data._M_elems[9] = local_7b8;
        local_858.data._M_elems[5] = local_7c8[0];
        local_858.data._M_elems[6] = local_7c8[1];
        local_858.data._M_elems[7] = auStack_7c0[0];
        local_858.data._M_elems[8] = auStack_7c0[1];
        local_858.data._M_elems[1] = local_7d8[0];
        local_858.data._M_elems[2] = local_7d8[1];
        local_858.data._M_elems[3] = auStack_7d0[0];
        local_858.data._M_elems[4] = auStack_7d0[1];
        local_858.exp = local_85c;
        local_858.prec_elem = iVar25;
        local_858.fpclass = fVar22;
        local_858.data._M_elems[0] = uVar26;
        local_858.neg = (bool)bVar27;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_858,&local_2d8);
        if (((local_858.fpclass != cpp_dec_float_NaN) && (local_e0.fpclass != cpp_dec_float_NaN)) &&
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_858,&local_e0), iVar16 < 0)) {
          local_4c8.m_backend.data._M_elems[9] = local_818.data._M_elems[9];
          local_4c8.m_backend.data._M_elems[8] = local_818.data._M_elems[8];
          local_4c8.m_backend.data._M_elems[1] = local_818.data._M_elems[1];
          local_4c8.m_backend.data._M_elems[0] = local_818.data._M_elems[0];
          local_4c8.m_backend.data._M_elems[3] = local_818.data._M_elems[3];
          local_4c8.m_backend.data._M_elems[2] = local_818.data._M_elems[2];
          local_4c8.m_backend.data._M_elems[5] = local_818.data._M_elems[5];
          local_4c8.m_backend.data._M_elems[4] = local_818.data._M_elems[4];
          local_4c8.m_backend.data._M_elems[7] = local_818.data._M_elems[7];
          local_4c8.m_backend.data._M_elems[6] = local_818.data._M_elems[6];
          local_4c8.m_backend.exp = local_818.exp;
          local_4c8.m_backend.neg = local_818.neg;
          local_4c8.m_backend.fpclass = local_818.fpclass;
          local_4c8.m_backend.prec_elem = local_818.prec_elem;
          local_318.m_backend.fpclass = cpp_dec_float_finite;
          local_318.m_backend.prec_elem = 10;
          local_318.m_backend.data._M_elems[0] = 0;
          local_318.m_backend.data._M_elems[1] = 0;
          local_318.m_backend.data._M_elems[2] = 0;
          local_318.m_backend.data._M_elems[3] = 0;
          local_318.m_backend.data._M_elems[4] = 0;
          local_318.m_backend.data._M_elems[5] = 0;
          local_318.m_backend.data._M_elems._24_5_ = 0;
          local_318.m_backend.data._M_elems[7]._1_3_ = 0;
          local_318.m_backend.data._M_elems._32_5_ = 0;
          local_318.m_backend._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_318,0.0);
          feastol(&local_68,this);
          bVar15 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_4c8,&local_318,&local_68);
          if (bVar15) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)
                       (local_690.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar1),0.0);
            goto LAB_00312aca;
          }
        }
        bVar14 = false;
      }
LAB_00312aca:
      local_6a8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems[0] = uVar26;
      puVar3 = local_6a8.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 1;
      *(uint (*) [2])puVar3 = local_7d8;
      *(uint (*) [2])(puVar3 + 2) = auStack_7d0;
      puVar3 = local_6a8.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 5;
      *(uint (*) [2])puVar3 = local_7c8;
      *(uint (*) [2])(puVar3 + 2) = auStack_7c0;
      local_6a8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems[9] = local_7b8;
      local_6a8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_85c;
      local_6a8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = (bool)bVar27;
      local_6a8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = fVar22;
      local_6a8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = iVar25;
      *(ulong *)(local_6c0.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 8) =
           CONCAT44(local_818.data._M_elems[9],local_818.data._M_elems[8]);
      puVar3 = local_6c0.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 4;
      *(ulong *)puVar3 = CONCAT44(local_818.data._M_elems[5],local_818.data._M_elems[4]);
      *(ulong *)(puVar3 + 2) = CONCAT44(local_818.data._M_elems[7],local_818.data._M_elems[6]);
      *(ulong *)local_6c0.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems =
           CONCAT44(local_818.data._M_elems[1],local_818.data._M_elems[0]);
      *(ulong *)(local_6c0.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 2) =
           CONCAT44(local_818.data._M_elems[3],local_818.data._M_elems[2]);
      local_6c0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_818.exp;
      local_6c0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = local_818.neg;
      local_6c0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = local_818.fpclass;
      local_6c0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = local_818.prec_elem;
      fVar20 = local_7a0.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass;
      fVar17 = local_788.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass;
      if ((fVar20 == cpp_dec_float_NaN) || (fVar17 == cpp_dec_float_NaN)) {
LAB_00312c15:
        if (((fVar20 == cpp_dec_float_NaN) || (fVar17 == cpp_dec_float_NaN)) ||
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_7a0.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,
                                &local_788.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend),
           -1 < iVar16)) {
          local_500.data._M_elems[9] = local_7b8;
          local_500.data._M_elems[5] = local_7c8[0];
          local_500.data._M_elems[6] = local_7c8[1];
          local_500.data._M_elems[7] = auStack_7c0[0];
          local_500.data._M_elems[8] = auStack_7c0[1];
          local_500.data._M_elems[1] = local_7d8[0];
          local_500.data._M_elems[2] = local_7d8[1];
          local_500.data._M_elems[3] = auStack_7d0[0];
          local_500.data._M_elems[4] = auStack_7d0[1];
          local_500.exp = local_85c;
          local_500.data._M_elems[0] = uVar26;
          local_500.neg = (bool)bVar27;
          local_500.fpclass = fVar22;
          local_500.prec_elem = iVar25;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_500,&local_818);
          local_758.fpclass = cpp_dec_float_finite;
          local_758.prec_elem = 10;
          local_758.data._M_elems[0] = 0;
          local_758.data._M_elems[1] = 0;
          local_758.data._M_elems[2] = 0;
          local_758.data._M_elems[3] = 0;
          local_758.data._M_elems[4] = 0;
          local_758.data._M_elems[5] = 0;
          local_758.data._M_elems._24_5_ = 0;
          local_758.data._M_elems[7]._1_3_ = 0;
          local_758.data._M_elems[8] = 0;
          local_758.data._M_elems[9] = 0;
          local_758.exp = 0;
          local_758.neg = false;
          local_858.fpclass = cpp_dec_float_finite;
          local_858.prec_elem = 10;
          local_858.data._M_elems[0] = 0;
          local_858.data._M_elems[1] = 0;
          local_858.data._M_elems[2] = 0;
          local_858.data._M_elems[3] = 0;
          local_858.data._M_elems[4] = 0;
          local_858.data._M_elems[5] = 0;
          local_858.data._M_elems[6] = 0;
          local_858.data._M_elems[7] = 0;
          local_858.data._M_elems[8] = 0;
          local_858.data._M_elems[9] = 0;
          local_858.exp = 0;
          local_858.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_858,2.0);
          lVar28 = local_7a8;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_758,&local_500,&local_858);
          *(ulong *)(local_770.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 8) =
               CONCAT44(local_758.data._M_elems[9],local_758.data._M_elems[8]);
          puVar3 = local_770.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar3 = local_758.data._M_elems._16_8_;
          *(ulong *)(puVar3 + 2) =
               CONCAT35(local_758.data._M_elems[7]._1_3_,local_758.data._M_elems._24_5_);
          *(undefined8 *)
           local_770.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems =
               local_758.data._M_elems._0_8_;
          *(undefined8 *)
           (local_770.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 2) =
               local_758.data._M_elems._8_8_;
          local_770.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_758.exp;
          local_770.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = local_758.neg;
          local_770.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = local_758.fpclass;
          local_770.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = local_758.prec_elem
          ;
        }
        else {
          local_770.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems[0] = uVar26;
          puVar3 = local_770.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 1;
          *(uint (*) [2])puVar3 = local_7d8;
          *(uint (*) [2])(puVar3 + 2) = auStack_7d0;
          puVar3 = local_770.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 5;
          *(uint (*) [2])puVar3 = local_7c8;
          *(uint (*) [2])(puVar3 + 2) = auStack_7c0;
          local_770.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems[9] = local_7b8;
          local_770.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_85c;
          local_770.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = (bool)bVar27;
          local_770.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = fVar22;
          local_770.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = iVar25;
          lVar28 = local_7a8;
        }
      }
      else {
        iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_7a0.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,
                            &local_788.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend);
        if (iVar16 < 1) {
          fVar20 = local_7a0.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass;
          fVar17 = local_788.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass;
          goto LAB_00312c15;
        }
        *(ulong *)(local_770.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 8) =
             CONCAT44(local_818.data._M_elems[9],local_818.data._M_elems[8]);
        puVar3 = local_770.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 4;
        *(ulong *)puVar3 = CONCAT44(local_818.data._M_elems[5],local_818.data._M_elems[4]);
        *(ulong *)(puVar3 + 2) = CONCAT44(local_818.data._M_elems[7],local_818.data._M_elems[6]);
        *(ulong *)local_770.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems =
             CONCAT44(local_818.data._M_elems[1],local_818.data._M_elems[0]);
        *(ulong *)(local_770.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.data._M_elems + 2) =
             CONCAT44(local_818.data._M_elems[3],local_818.data._M_elems[2]);
        local_770.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_818.exp;
        local_770.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = local_818.neg;
        local_770.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = local_818.fpclass;
        local_770.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = local_818.prec_elem;
        lVar28 = local_7a8;
      }
      pcVar19 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      pcVar24 = &local_6a8.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      local_858.fpclass = cpp_dec_float_finite;
      local_858.prec_elem = 10;
      local_858.data._M_elems[0] = 0;
      local_858.data._M_elems[1] = 0;
      local_858.data._M_elems[2] = 0;
      local_858.data._M_elems[3] = 0;
      local_858.data._M_elems[4] = 0;
      local_858.data._M_elems[5] = 0;
      local_858.data._M_elems[6] = 0;
      local_858.data._M_elems[7] = 0;
      local_858.data._M_elems[8] = 0;
      local_858.data._M_elems[9] = 0;
      local_858.exp = 0;
      local_858.neg = false;
      pcVar21 = pcVar19;
      if ((&local_858 != pcVar24) && (pcVar21 = pcVar24, &local_858 != pcVar19)) {
        uVar8 = *(undefined8 *)((pcVar19->data)._M_elems + 8);
        local_858.data._M_elems[8] = (uint)uVar8;
        local_858.data._M_elems[9] = (uint)((ulong)uVar8 >> 0x20);
        uVar8 = *(undefined8 *)(pcVar19->data)._M_elems;
        uVar11 = *(undefined8 *)((pcVar19->data)._M_elems + 2);
        uVar12 = *(undefined8 *)((pcVar19->data)._M_elems + 4);
        uVar13 = *(undefined8 *)((pcVar19->data)._M_elems + 6);
        local_858.data._M_elems[4] = (uint)uVar12;
        local_858.data._M_elems[5] = (uint)((ulong)uVar12 >> 0x20);
        local_858.data._M_elems[6] = (uint)uVar13;
        local_858.data._M_elems[7] = (uint)((ulong)uVar13 >> 0x20);
        local_858.data._M_elems[0] = (uint)uVar8;
        local_858.data._M_elems[1] = (uint)((ulong)uVar8 >> 0x20);
        local_858.data._M_elems[2] = (uint)uVar11;
        local_858.data._M_elems[3] = (uint)((ulong)uVar11 >> 0x20);
        local_858.exp = pcVar19->exp;
        local_858.neg = pcVar19->neg;
        local_858.fpclass = pcVar19->fpclass;
        local_858.prec_elem = pcVar19->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_858,pcVar21)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_5f8,&local_858);
      pcVar19 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      pcVar24 = &local_6c0.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      local_858.fpclass = cpp_dec_float_finite;
      local_858.prec_elem = 10;
      local_858.data._M_elems[0] = 0;
      local_858.data._M_elems[1] = 0;
      local_858.data._M_elems[2] = 0;
      local_858.data._M_elems[3] = 0;
      local_858.data._M_elems[4] = 0;
      local_858.data._M_elems[5] = 0;
      local_858.data._M_elems[6] = 0;
      local_858.data._M_elems[7] = 0;
      local_858.data._M_elems[8] = 0;
      local_858.data._M_elems[9] = 0;
      local_858.exp = 0;
      local_858.neg = false;
      pcVar21 = pcVar19;
      if ((&local_858 != pcVar24) && (pcVar21 = pcVar24, &local_858 != pcVar19)) {
        uVar8 = *(undefined8 *)((pcVar19->data)._M_elems + 8);
        local_858.data._M_elems[8] = (uint)uVar8;
        local_858.data._M_elems[9] = (uint)((ulong)uVar8 >> 0x20);
        uVar8 = *(undefined8 *)(pcVar19->data)._M_elems;
        uVar11 = *(undefined8 *)((pcVar19->data)._M_elems + 2);
        uVar12 = *(undefined8 *)((pcVar19->data)._M_elems + 4);
        uVar13 = *(undefined8 *)((pcVar19->data)._M_elems + 6);
        local_858.data._M_elems[4] = (uint)uVar12;
        local_858.data._M_elems[5] = (uint)((ulong)uVar12 >> 0x20);
        local_858.data._M_elems[6] = (uint)uVar13;
        local_858.data._M_elems[7] = (uint)((ulong)uVar13 >> 0x20);
        local_858.data._M_elems[0] = (uint)uVar8;
        local_858.data._M_elems[1] = (uint)((ulong)uVar8 >> 0x20);
        local_858.data._M_elems[2] = (uint)uVar11;
        local_858.data._M_elems[3] = (uint)((ulong)uVar11 >> 0x20);
        local_858.exp = pcVar19->exp;
        local_858.neg = pcVar19->neg;
        local_858.fpclass = pcVar19->fpclass;
        local_858.prec_elem = pcVar19->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_858,pcVar21)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_638,&local_858);
      pcVar19 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      pcVar24 = &local_770.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      local_858.fpclass = cpp_dec_float_finite;
      local_858.prec_elem = 10;
      local_858.data._M_elems[0] = 0;
      local_858.data._M_elems[1] = 0;
      local_858.data._M_elems[2] = 0;
      local_858.data._M_elems[3] = 0;
      local_858.data._M_elems[4] = 0;
      local_858.data._M_elems[5] = 0;
      local_858.data._M_elems[6] = 0;
      local_858.data._M_elems[7] = 0;
      local_858.data._M_elems[8] = 0;
      local_858.data._M_elems[9] = 0;
      local_858.exp = 0;
      local_858.neg = false;
      pcVar21 = pcVar19;
      if ((&local_858 != pcVar24) && (pcVar21 = pcVar24, &local_858 != pcVar19)) {
        uVar8 = *(undefined8 *)((pcVar19->data)._M_elems + 8);
        local_858.data._M_elems[8] = (uint)uVar8;
        local_858.data._M_elems[9] = (uint)((ulong)uVar8 >> 0x20);
        uVar8 = *(undefined8 *)(pcVar19->data)._M_elems;
        uVar11 = *(undefined8 *)((pcVar19->data)._M_elems + 2);
        uVar12 = *(undefined8 *)((pcVar19->data)._M_elems + 4);
        uVar13 = *(undefined8 *)((pcVar19->data)._M_elems + 6);
        local_858.data._M_elems[4] = (uint)uVar12;
        local_858.data._M_elems[5] = (uint)((ulong)uVar12 >> 0x20);
        local_858.data._M_elems[6] = (uint)uVar13;
        local_858.data._M_elems[7] = (uint)((ulong)uVar13 >> 0x20);
        local_858.data._M_elems[0] = (uint)uVar8;
        local_858.data._M_elems[1] = (uint)((ulong)uVar8 >> 0x20);
        local_858.data._M_elems[2] = (uint)uVar11;
        local_858.data._M_elems[3] = (uint)((ulong)uVar11 >> 0x20);
        local_858.exp = pcVar19->exp;
        local_858.neg = pcVar19->neg;
        local_858.fpclass = pcVar19->fpclass;
        local_858.prec_elem = pcVar19->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_858,pcVar21)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_678,&local_858);
      lVar23 = local_568;
    } while (1 < lVar28);
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&local_518,&local_6a8);
  bVar15 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)&local_518);
  if (local_518.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_518.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_518.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_518.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((bVar15) && (local_5f8.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_5f8,&(this->m_cutoffbound).m_backend);
    if (0 < iVar16) {
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
           local_5f8.data._M_elems._32_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
           local_5f8.data._M_elems._16_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
           local_5f8.data._M_elems._24_8_;
      *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems = local_5f8.data._M_elems._0_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
           local_5f8.data._M_elems._8_8_;
      (this->m_cutoffbound).m_backend.exp = local_5f8.exp;
      (this->m_cutoffbound).m_backend.neg = local_5f8.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_5f8.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_5f8.prec_elem;
    }
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&local_530,&local_6c0);
  bVar15 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)&local_530);
  if (local_530.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_530.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_530.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_530.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((bVar15) && (local_638.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_638,&(this->m_cutoffbound).m_backend);
    if (0 < iVar16) {
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
           local_638.data._M_elems._32_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
           local_638.data._M_elems._16_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
           local_638.data._M_elems._24_8_;
      *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems = local_638.data._M_elems._0_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
           local_638.data._M_elems._8_8_;
      (this->m_cutoffbound).m_backend.exp = local_638.exp;
      (this->m_cutoffbound).m_backend.neg = local_638.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_638.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_638.prec_elem;
    }
  }
  if (bVar14) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::vector(&local_548,&local_690);
    bVar14 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)&local_548);
    if (local_548.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_548.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_548.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_548.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (((bVar14) && (local_5b8.fpclass != cpp_dec_float_NaN)) &&
       ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
      iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_5b8,&(this->m_cutoffbound).m_backend);
      if (0 < iVar16) {
        *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
             local_5b8.data._M_elems._32_8_;
        *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
             local_5b8.data._M_elems._16_8_;
        *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
             local_5b8.data._M_elems._24_8_;
        *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems = local_5b8.data._M_elems._0_8_
        ;
        *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
             local_5b8.data._M_elems._8_8_;
        (this->m_cutoffbound).m_backend.exp = local_5b8.exp;
        (this->m_cutoffbound).m_backend.neg = local_5b8.neg;
        (this->m_cutoffbound).m_backend.fpclass = local_5b8.fpclass;
        (this->m_cutoffbound).m_backend.prec_elem = local_5b8.prec_elem;
      }
    }
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&local_560,&local_770);
  bVar14 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)&local_560);
  if (local_560.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_560.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_560.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_560.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((bVar14) && (local_678.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_678,&(this->m_cutoffbound).m_backend);
    if (0 < iVar16) {
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
           local_678.data._M_elems._32_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
           local_678.data._M_elems._16_8_;
      *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
           local_678.data._M_elems._24_8_;
      *(ulong *)(this->m_cutoffbound).m_backend.data._M_elems =
           CONCAT44(local_678.data._M_elems[1],local_678.data._M_elems[0]);
      *(ulong *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
           CONCAT44(local_678.data._M_elems[3],local_678.data._M_elems[2]);
      (this->m_cutoffbound).m_backend.exp = local_678.exp;
      (this->m_cutoffbound).m_backend.neg = local_678.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_678.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_678.prec_elem;
    }
  }
  if (local_7a0.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_7a0.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_7a0.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_7a0.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_788.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_788.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_788.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_788.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_770.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_770.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_770.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_770.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_6c0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6c0.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6c0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6c0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_6a8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6a8.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6a8.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6a8.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_690.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_690.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_690.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_690.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxMainSM<R>::trivialHeuristic(SPxLPBase<R>& lp)
{
   VectorBase<R>         zerosol(lp.nCols());  // the zero solution VectorBase<R>
   VectorBase<R>         lowersol(lp.nCols()); // the lower bound solution VectorBase<R>
   VectorBase<R>         uppersol(lp.nCols()); // the upper bound solution VectorBase<R>
   VectorBase<R>         locksol(lp.nCols());  // the locks solution VectorBase<R>

   VectorBase<R>         upLocks(lp.nCols());
   VectorBase<R>         downLocks(lp.nCols());

   R            zeroObj = this->m_objoffset;
   R            lowerObj = this->m_objoffset;
   R            upperObj = this->m_objoffset;
   R            lockObj = this->m_objoffset;

   bool            zerovalid = true;

   R largeValue = R(infinity);

   if(LT(R(1.0 / feastol()), R(infinity), this->tolerances()->epsilon()))
      largeValue = 1.0 / feastol();



   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      upLocks[j] = 0;
      downLocks[j] = 0;

      // computing the locks on the variables
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon())
               && LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      R lower = lp.lower(j);
      R upper = lp.upper(j);

      if(LE(lower, R(-infinity), this->tolerances()->epsilon()))
         lower = SOPLEX_MIN(-largeValue, upper);

      if(GE(upper, R(infinity), this->tolerances()->epsilon()))
         upper = SOPLEX_MAX(lp.lower(j), largeValue);

      if(zerovalid)
      {
         if(LE(lower, R(0.0), feastol()) && GE(upper, R(0.0), feastol()))
            zerosol[j] = 0.0;
         else
            zerovalid = false;
      }

      lowersol[j] = lower;
      uppersol[j] = upper;

      if(downLocks[j] > upLocks[j])
         locksol[j] = upper;
      else if(downLocks[j] < upLocks[j])
         locksol[j] = lower;
      else
         locksol[j] = (lower + upper) / 2.0;

      lowerObj += lp.maxObj(j) * lowersol[j];
      upperObj += lp.maxObj(j) * uppersol[j];
      lockObj += lp.maxObj(j) * locksol[j];
   }

   // trying the lower bound solution
   if(checkSolution(lp, lowersol))
   {
      if(lowerObj > m_cutoffbound)
         m_cutoffbound = lowerObj;
   }

   // trying the upper bound solution
   if(checkSolution(lp, uppersol))
   {
      if(upperObj > m_cutoffbound)
         m_cutoffbound = upperObj;
   }

   // trying the zero solution
   if(zerovalid && checkSolution(lp, zerosol))
   {
      if(zeroObj > m_cutoffbound)
         m_cutoffbound = zeroObj;
   }

   // trying the lock solution
   if(checkSolution(lp, locksol))
   {
      if(lockObj > m_cutoffbound)
         m_cutoffbound = lockObj;
   }
}